

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O3

void LinkedList_RemoveEntry(LinkedList **start,void *toRemove,FAudioMutex lock,FAudioFreeFunc pFree)

{
  LinkedList *pLVar1;
  void *pvVar2;
  LinkedList *pLVar3;
  LinkedList *pLVar4;
  LinkedList **ppLVar5;
  
  pLVar1 = *start;
  FAudio_PlatformLockMutex(lock);
  if (pLVar1 != (LinkedList *)0x0) {
    pvVar2 = pLVar1->entry;
    pLVar4 = pLVar1;
    while (pLVar3 = pLVar1, pvVar2 != toRemove) {
      pLVar1 = pLVar3->next;
      if (pLVar1 == (LinkedList *)0x0) goto LAB_00119440;
      pvVar2 = pLVar1->entry;
      pLVar4 = pLVar3;
    }
    ppLVar5 = &pLVar4->next;
    if (pLVar3 == pLVar4) {
      ppLVar5 = start;
    }
    *ppLVar5 = pLVar3->next;
    (*pFree)(pLVar3);
  }
LAB_00119440:
  FAudio_PlatformUnlockMutex(lock);
  return;
}

Assistant:

void LinkedList_RemoveEntry(
	LinkedList **start,
	void* toRemove,
	FAudioMutex lock,
	FAudioFreeFunc pFree
) {
	LinkedList *latest, *prev;
	latest = *start;
	prev = latest;
	FAudio_PlatformLockMutex(lock);
	while (latest != NULL)
	{
		if (latest->entry == toRemove)
		{
			if (latest == prev) /* First in list */
			{
				*start = latest->next;
			}
			else
			{
				prev->next = latest->next;
			}
			pFree(latest);
			FAudio_PlatformUnlockMutex(lock);
			return;
		}
		prev = latest;
		latest = latest->next;
	}
	FAudio_PlatformUnlockMutex(lock);
	FAudio_assert(0 && "LinkedList element not found!");
}